

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMappingValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)606>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  CategoricalMapping *pCVar5;
  GLMRegressor *pGVar6;
  LogMessage *pLVar7;
  undefined8 *puVar8;
  SequenceFeatureType *pSVar9;
  Type *pTVar10;
  FeatureType *pFVar11;
  ArrayFeatureType *pAVar12;
  long *plVar13;
  undefined8 *puVar14;
  long *plVar15;
  size_type *psVar16;
  ModelDescription *from;
  undefined1 auVar17 [8];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  uint32 uVar18;
  uint32 unaff_R13D;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  ModelDescription interface;
  allocator_type local_14d;
  int local_14c;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [40];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_110;
  long lStack_f8;
  size_type *local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  size_type local_b8 [2];
  undefined1 local_a8 [24];
  int local_90;
  Rep *local_88;
  RepeatedPtrFieldBase local_80 [3];
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription((ModelDescription *)local_a8,from);
  Result::Result((Result *)&local_f0);
  validateModelDescription
            ((Result *)local_148,(ModelDescription *)local_a8,format->specificationversion_);
  local_f0 = (size_type *)local_148;
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_140);
  pcVar2 = local_138 + 8;
  if (local_140._M_p != pcVar2) {
    operator_delete(local_140._M_p,local_138._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_f0);
  if (bVar4) {
    if (format->_oneof_case_[0] == 0x25e) {
      pGVar6 = (GLMRegressor *)(format->Type_).imputer_;
      uVar18 = *(uint32 *)((long)&pGVar6->weights_ + 0x14);
    }
    else {
      pCVar5 = Specification::CategoricalMapping::default_instance();
      uVar18 = pCVar5->_oneof_case_[0];
      if (format->_oneof_case_[0] == 0x25e) {
        pGVar6 = (format->Type_).glmregressor_;
      }
      else {
        pGVar6 = (GLMRegressor *)Specification::CategoricalMapping::default_instance();
      }
    }
    if (uVar18 == 0) {
      local_148 = (undefined1  [8])local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Mapping not set.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_148);
LAB_004d7250:
      local_b8[0] = local_138._0_8_;
      auVar17 = local_148;
      if (local_148 == (undefined1  [8])local_138) goto LAB_004d76f7;
LAB_004d7263:
      operator_delete((void *)auVar17,local_b8[0] + 1);
      goto LAB_004d76f7;
    }
    iVar3 = (pGVar6->offset_).current_size_;
    if (uVar18 == 1) {
      if (iVar3 == 0x65) {
        local_148 = (undefined1  [8])local_138;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,
                   "ValueOnUnknown set to string value while mapping produces int64.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_148);
        goto LAB_004d7250;
      }
      unaff_R13D = 3;
      local_14c = 1;
    }
    else if (uVar18 == 2) {
      if (iVar3 == 0x66) {
        local_148 = (undefined1  [8])local_138;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,
                   "ValueOnUnknown set to Int64 value while mapping produces string.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_148);
        goto LAB_004d7250;
      }
      unaff_R13D = 1;
      local_14c = 3;
    }
    local_c8 = (size_type *)CONCAT44(7,unaff_R13D);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_c8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_110,__l,&local_14d);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_148,(CoreML *)(local_a8 + 0x10),
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_110,
               in_R8);
    local_f0 = (size_type *)local_148;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_140);
    if (local_140._M_p != pcVar2) {
      operator_delete(local_140._M_p,local_138._8_8_ + 1);
    }
    if ((pointer *)
        local_110.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_110.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar4 = Result::good((Result *)&local_f0);
    if (bVar4) {
      local_c8 = (size_type *)CONCAT44(7,local_14c);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_c8;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_110,__l_00,&local_14d);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_148,(CoreML *)local_80,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_110,
                 in_R8);
      local_f0 = (size_type *)local_148;
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_140);
      if (local_140._M_p != pcVar2) {
        operator_delete(local_140._M_p,local_138._8_8_ + 1);
      }
      if ((pointer *)
          local_110.
          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_110.
                        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar4 = Result::good((Result *)&local_f0);
      if (bVar4) {
        if (local_90 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_148,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
        }
        puVar8 = *(undefined8 **)((long)local_88->elements[0] + 0x20);
        puVar14 = puVar8;
        if (puVar8 == (undefined8 *)0x0) {
          puVar14 = &Specification::_FeatureType_default_instance_;
        }
        if (*(int *)((long)puVar14 + 0x24) == 7) {
          if (local_90 < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar7 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_148,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar7);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
            puVar8 = *(undefined8 **)((long)local_88->elements[0] + 0x20);
          }
          if (puVar8 == (undefined8 *)0x0) {
            puVar8 = &Specification::_FeatureType_default_instance_;
          }
          if (*(int *)((long)puVar8 + 0x24) == 7) {
            pSVar9 = (SequenceFeatureType *)puVar8[3];
          }
          else {
            pSVar9 = Specification::SequenceFeatureType::default_instance();
          }
          if (pSVar9->_oneof_case_[0] == unaff_R13D) {
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_80,0);
            pFVar11 = pTVar10->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar11->_oneof_case_[0] != 7) {
              local_148 = (undefined1  [8])local_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_148,
                         "Output of a sequence categorical mapping must be a sequence","");
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             (string *)local_148);
              goto LAB_004d7250;
            }
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_80,0);
            pFVar11 = pTVar10->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar11->_oneof_case_[0] == 7) {
              pAVar12 = (pFVar11->Type_).multiarraytype_;
            }
            else {
              pAVar12 = (ArrayFeatureType *)Specification::SequenceFeatureType::default_instance();
            }
            if (pAVar12->datatype_ == local_14c) goto LAB_004d76a0;
            local_c8 = local_b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"Output sequence type does not match input type ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
            local_110.
            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&local_110.
                           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            plVar13 = puVar8 + 2;
            if ((pointer *)*puVar8 == (pointer *)plVar13) {
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
              lStack_f8 = puVar8[3];
            }
            else {
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar8;
            }
            local_110.
            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar8[1];
            *puVar8 = plVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
            local_148 = (undefined1  [8])local_138;
            psVar16 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar16) {
              local_138._0_8_ = *psVar16;
              local_138._8_8_ = plVar13[3];
            }
            else {
              local_138._0_8_ = *psVar16;
              local_148 = (undefined1  [8])*plVar13;
            }
            local_140._M_p = (pointer)plVar13[1];
            *plVar13 = (long)psVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)local_148);
          }
          else {
            local_c8 = local_b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"Input sequence type does not match input type ","");
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_c8);
            local_110.
            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&local_110.
                           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            plVar15 = plVar13 + 2;
            if ((pointer *)*plVar13 == (pointer *)plVar15) {
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
              lStack_f8 = plVar13[3];
            }
            else {
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
            }
            local_110.
            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
            *plVar13 = (long)plVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
            local_148 = (undefined1  [8])local_138;
            psVar16 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar16) {
              local_138._0_8_ = *psVar16;
              local_138._8_8_ = plVar13[3];
            }
            else {
              local_138._0_8_ = *psVar16;
              local_148 = (undefined1  [8])*plVar13;
            }
            local_140._M_p = (pointer)plVar13[1];
            *plVar13 = (long)psVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)local_148);
          }
          if (local_148 != (undefined1  [8])local_138) {
            operator_delete((void *)local_148,local_138._0_8_ + 1);
          }
          if ((pointer *)
              local_110.
              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              &local_110.
               super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_110.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)local_110.
                                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          auVar17 = (undefined1  [8])local_c8;
          if (local_c8 == local_b8) goto LAB_004d76f7;
          goto LAB_004d7263;
        }
      }
    }
  }
LAB_004d76a0:
  *(size_type **)__return_storage_ptr__ = local_f0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p == &local_d8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_d8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_e8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
LAB_004d76f7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  Specification::ModelDescription::~ModelDescription((ModelDescription *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_categoricalMapping>(const Specification::Model& format) {
        auto interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        auto mapping_type = format.categoricalmapping().MappingType_case();
        auto defval_type = format.categoricalmapping().ValueOnUnknown_case();
        Specification::FeatureType::TypeCase requiredInputType;
        Specification::FeatureType::TypeCase requiredOutputType;
        Specification::SequenceFeatureType::TypeCase requiredInputSeqType;
        Specification::SequenceFeatureType::TypeCase requiredOutputSeqType;

        switch(mapping_type) {
            case Specification::CategoricalMapping::MappingTypeCase::kStringToInt64Map:
                
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kStrValue) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to string value while mapping produces int64.");
                }
                requiredInputType = Specification::FeatureType::kStringType;
                requiredOutputType = Specification::FeatureType::kInt64Type;
                requiredInputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredOutputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::kInt64ToStringMap:
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kInt64Value) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to Int64 value while mapping produces string.");
                }
                requiredOutputType = Specification::FeatureType::kStringType;
                requiredInputType = Specification::FeatureType::kInt64Type;
                requiredOutputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredInputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::MAPPINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Mapping not set.");
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {requiredInputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {requiredOutputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }

        // Check if the input was a sequence
        if (interface.input(0).type().Type_case() == Specification::FeatureType::kSequenceType) {

            // Make sure its the correct input type
            if (interface.input(0).type().sequencetype().Type_case() != requiredInputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Input sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredInputType)) +
                              "of categorical mapping.");
            }

            // Make sure the outupt is a sequence as well
            if (interface.output(0).type().Type_case() != Specification::FeatureType::kSequenceType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              "Output of a sequence categorical mapping must be a sequence");
            }

            // Make sure the otuput is the correct type
            if (interface.output(0).type().sequencetype().Type_case() != requiredOutputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Output sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredOutputType)) +
                              "of categorical mapping.");
            }
        }


        // Validate the parameters
        return result;
    }